

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmMakefile *this_01;
  pointer pbVar2;
  pointer ppcVar3;
  bool bVar4;
  ModuleDefinitionInfo *path;
  string *psVar5;
  cmValue cVar6;
  ostream *poVar7;
  string *obj;
  pointer pbVar8;
  pointer ppcVar9;
  string_view str;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  string objlist_file;
  string cmd;
  cmGeneratedFileStream fout;
  char local_321;
  string local_320;
  string local_300;
  ModuleDefinitionInfo *local_2e0;
  value_type local_2d8;
  string local_2b8;
  cmGeneratedFileStream local_298;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&local_298,this);
  path = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  if ((path != (ModuleDefinitionInfo *)0x0) && (path->DefFileGenerated != false)) {
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::string((string *)&local_2d8,(string *)psVar5);
    source._M_str = local_2d8._M_dataplus._M_p;
    source._M_len = local_2d8._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_300,(cmOutputConverter *)this->LocalGenerator,source,SHELL,false);
    pcVar1 = this->LocalGenerator;
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&local_2b8,(cmOutputConverter *)pcVar1,&path->DefFile);
    source_00._M_str = local_2b8._M_dataplus._M_p;
    source_00._M_len = local_2b8._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_320,(cmOutputConverter *)pcVar1,source_00,SHELL,false);
    local_321 = ' ';
    cmStrCat<std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char>
              ((string *)&local_298,&local_300,(char (*) [18])" -E __create_def ",&local_320,
               &local_321);
    std::__cxx11::string::operator=((string *)&local_2d8,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_300);
    std::operator+(&local_300,&path->DefFile,".objs");
    pcVar1 = this->LocalGenerator;
    cmOutputConverter::MaybeRelativeToCurBinDir(&local_320,(cmOutputConverter *)pcVar1,&local_300);
    source_01._M_str = local_320._M_dataplus._M_p;
    source_01._M_len = local_320._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)&local_298,(cmOutputConverter *)pcVar1,source_01,SHELL,false);
    std::__cxx11::string::append((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_320);
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"CMAKE_NM",(allocator<char> *)&local_320);
    cVar6 = cmMakefile::GetDefinition(this_01,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
      std::__cxx11::string::append((char *)&local_2d8);
      source_02._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
      source_02._M_len = (cVar6.Value)->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)&local_298,
                 (cmOutputConverter *)(this->super_cmCommonTargetGenerator).LocalCommonGenerator,
                 source_02,SHELL,false);
      std::__cxx11::string::append((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_298);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(real_link_commands,
             (real_link_commands->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_2d8);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_298,&local_300,false,None);
    if (path->WindowsExportAllSymbols == true) {
      pbVar2 = (this->Objects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_2e0 = path;
      for (pbVar8 = (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; path = local_2e0, pbVar8 != pbVar2;
          pbVar8 = pbVar8 + 1) {
        str._M_str = (pbVar8->_M_dataplus)._M_p;
        str._M_len = pbVar8->_M_string_length;
        bVar4 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])".obj");
        if (bVar4) {
          poVar7 = std::operator<<((ostream *)&local_298,(string *)pbVar8);
          std::operator<<(poVar7,"\n");
        }
      }
      pbVar2 = (this->ExternalObjects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (this->ExternalObjects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1
          ) {
        poVar7 = std::operator<<((ostream *)&local_298,(string *)pbVar8);
        std::operator<<(poVar7,"\n");
      }
    }
    ppcVar3 = (path->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar9 = (path->Sources).
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar3;
        ppcVar9 = ppcVar9 + 1) {
      psVar5 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar9);
      poVar7 = std::operator<<((ostream *)&local_298,(string *)psVar5);
      std::operator<<(poVar7,"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_298);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd = cmStrCat(
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL),
    " -E __create_def ",
    this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(mdi->DefFile),
      cmOutputConverter::SHELL),
    ' ');
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeRelativeToCurBinDir(objlist_file),
    cmOutputConverter::SHELL);
  cmValue const nm_executable = this->Makefile->GetDefinition("CMAKE_NM");
  if (cmNonempty(nm_executable)) {
    cmd += " --nm=";
    cmd += this->LocalCommonGenerator->ConvertToOutputFormat(
      *nm_executable, cmOutputConverter::SHELL);
  }
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file);

  if (mdi->WindowsExportAllSymbols) {
    for (std::string const& obj : this->Objects) {
      if (cmHasLiteralSuffix(obj, ".obj")) {
        fout << obj << "\n";
      }
    }
    for (std::string const& obj : this->ExternalObjects) {
      fout << obj << "\n";
    }
  }

  for (cmSourceFile const* src : mdi->Sources) {
    fout << src->GetFullPath() << "\n";
  }
}